

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O3

vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *
vectors_difference(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                   *__return_storage_ptr__,
                  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *v1,
                  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *v2)

{
  long lVar1;
  ulong uVar2;
  pointer pVVar3;
  pointer pVVar4;
  
  (__return_storage_ptr__->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar4 = (v1->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3 = (v1->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar4 != pVVar3) {
    uVar2 = (long)pVVar3 - (long)pVVar4 >> 4;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pVVar4,pVVar3,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pVVar4,pVVar3);
  }
  pVVar4 = (v2->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3 = (v2->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar4 != pVVar3) {
    uVar2 = (long)pVVar3 - (long)pVVar4 >> 4;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pVVar4,pVVar3,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pVVar4,pVVar3);
    pVVar4 = (v2->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pVVar3 = (v2->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  std::
  __set_difference<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::back_insert_iterator<std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((v1->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (v1->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
             super__Vector_impl_data._M_finish,pVVar4,pVVar3,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

vector<mir::inst::VarId> vectors_difference(vector<mir::inst::VarId> v1,
                                            vector<mir::inst::VarId> v2) {
  vector<mir::inst::VarId> v;
  sort(v1.begin(), v1.end());
  sort(v2.begin(), v2.end());
  set_difference(v1.begin(), v1.end(), v2.begin(), v2.end(), back_inserter(v));
  return v;
}